

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

void fld_export(uint8_t *dst,limb_t *src)

{
  limb_t *in_RSI;
  undefined1 *in_RDI;
  int fill;
  uint64_t foo;
  fld_t tmp;
  int i;
  int local_54;
  ulong local_50;
  limb_t local_48 [6];
  int local_14;
  undefined1 *local_8;
  
  local_50 = 0;
  local_54 = 0;
  local_8 = in_RDI;
  fld_reduce(local_48,in_RSI);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    local_50 = local_48[local_14] << ((byte)local_54 & 0x3f) | local_50;
    for (local_54 = local_54 + 0x33; 7 < local_54; local_54 = local_54 + -8) {
      *local_8 = (char)local_50;
      local_50 = local_50 >> 8;
      local_8 = local_8 + 1;
    }
  }
  *local_8 = (char)local_50;
  return;
}

Assistant:

void
fld_export(uint8_t dst[32], const fld_t src)
{
	int i;
	fld_t tmp;
	uint64_t foo = 0;
	int fill = 0;
	
	fld_reduce(tmp, src);

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += FLD_LIMB_BITS; fill >= 8; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
	*dst++ = foo & 0xff;
}